

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cpp
# Opt level: O3

void BrotliCompressFragmentTwoPassImpl16
               (BrotliTwoPassArena *s,uint8_t *input,size_t input_size,int is_last,
               uint32_t *command_buf,uint8_t *literal_buf,int *table,size_t *storage_ix,
               uint8_t *storage)

{
  long *plVar1;
  ulong uVar2;
  long *plVar3;
  long *plVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint8_t *s1_orig;
  uint8_t *puVar8;
  uint8_t *puVar9;
  byte bVar10;
  undefined4 in_register_0000000c;
  uint32_t *commands;
  long lVar11;
  int *piVar12;
  long lVar13;
  int iVar14;
  long *input_00;
  ulong uVar15;
  long *plVar16;
  long *__src;
  long lVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  uint8_t *puVar23;
  uint8_t *puVar24;
  int iVar25;
  size_t input_size_00;
  long *plVar26;
  bool bVar27;
  uint *local_90;
  uint32_t *local_88;
  
  commands = (uint32_t *)CONCAT44(in_register_0000000c,is_last);
  input_00 = (long *)input;
  if (input_size != 0) {
    do {
      input_size_00 = 0x20000;
      if (input_size < 0x20000) {
        input_size_00 = input_size;
      }
      plVar1 = (long *)((long)input_00 + input_size_00);
      local_88 = command_buf;
      __src = input_00;
      local_90 = commands;
      if (0xf < input_size) {
        uVar15 = input_size - 0x10;
        if (input_size_00 - 6 < input_size - 0x10) {
          uVar15 = input_size_00 - 6;
        }
        plVar26 = (long *)(uVar15 + (long)input_00);
        iVar7 = -1;
LAB_0114027b:
        plVar16 = (long *)((long)__src + 1);
        uVar15 = (ulong)(*(long *)((long)__src + 1) * 0x1e35a7bd0000) >> 0x30;
        uVar21 = 0x20;
        do {
          uVar18 = (uint)uVar21;
          plVar4 = (long *)((uVar21 >> 5) + (long)plVar16);
          plVar3 = plVar16;
          uVar2 = uVar15;
          while( true ) {
            plVar16 = plVar4;
            if (plVar26 < plVar16) goto LAB_0114089c;
            uVar18 = uVar18 + 1;
            uVar21 = (ulong)uVar18;
            uVar15 = (ulong)(*plVar16 * 0x1e35a7bd0000) >> 0x30;
            iVar25 = (int)input;
            iVar14 = (int)plVar3;
            if (((((int)*plVar3 == *(int *)((long)plVar3 + -(long)iVar7)) &&
                 (puVar8 = (uint8_t *)((long)plVar3 + -(long)iVar7),
                 *(uint8_t *)((long)plVar3 + 4) == puVar8[4])) &&
                (*(uint8_t *)((long)plVar3 + 5) == puVar8[5])) && (0 < iVar7)) break;
            iVar6 = *(int *)(literal_buf + uVar2 * 4);
            *(int *)(literal_buf + uVar2 * 4) = iVar14 - iVar25;
            if ((((int)*plVar3 == *(int *)(input + iVar6)) &&
                (puVar8 = input + iVar6, *(uint8_t *)((long)plVar3 + 4) == puVar8[4])) &&
               (*(uint8_t *)((long)plVar3 + 5) == puVar8[5])) goto LAB_0114033a;
            plVar4 = (long *)((ulong)(uVar18 >> 5) + (long)plVar16);
            plVar3 = plVar16;
            uVar2 = uVar15;
          }
          *(int *)(literal_buf + uVar2 * 4) = iVar14 - iVar25;
LAB_0114033a:
        } while (0x3fff0 < (long)plVar3 - (long)puVar8);
        puVar9 = puVar8 + 6;
        lVar11 = (long)plVar3 + 6;
        uVar15 = (long)plVar1 + (-6 - (long)plVar3);
        puVar23 = puVar9;
        if (7 < uVar15) {
          lVar17 = 0;
LAB_01140365:
          if (*(ulong *)(lVar11 + lVar17) == *(ulong *)(puVar9 + lVar17)) goto code_r0x01140372;
          uVar21 = *(ulong *)(puVar9 + lVar17) ^ *(ulong *)(lVar11 + lVar17);
          uVar15 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          lVar17 = (uVar15 >> 3 & 0x1fffffff) + lVar17;
          goto LAB_011403c5;
        }
        goto LAB_0114038c;
      }
LAB_0114089c:
      if (__src < plVar1) {
        uVar18 = (uint)((long)plVar1 - (long)__src);
        if (5 < uVar18) {
          if (uVar18 < 0x82) {
            uVar18 = uVar18 - 2;
            uVar5 = 0x1f;
            if (uVar18 != 0) {
              for (; uVar18 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            bVar10 = (char)(uVar5 ^ 0xffffffe0) + 0x1f;
            uVar20 = uVar18 >> (bVar10 & 0x1f);
            uVar18 = (uVar18 - (uVar20 << (bVar10 & 0x1f))) * 0x100 |
                     uVar20 + (uVar5 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar18 < 0x842) {
            uVar5 = 0x1f;
            if (uVar18 - 0x42 != 0) {
              for (; uVar18 - 0x42 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            uVar18 = (((-1 << ((byte)uVar5 & 0x1f)) + uVar18 + -0x42) * 0x100 - (uVar5 ^ 0x1f)) +
                     0x29;
          }
          else {
            iVar7 = uVar18 * 0x100;
            if (uVar18 < 0x1842) {
              uVar18 = iVar7 - 0x841eb;
            }
            else if (uVar18 < 0x5842) {
              uVar18 = iVar7 - 0x1841ea;
            }
            else {
              uVar18 = iVar7 - 0x5841e9;
            }
          }
        }
        *local_90 = uVar18;
        local_90 = local_90 + 1;
        uVar15 = (long)plVar1 - (long)__src & 0xffffffff;
        switchD_00b041bd::default(local_88,__src,uVar15);
        local_88 = (uint32_t *)((long)local_88 + uVar15);
      }
      iVar7 = ShouldCompress(s,(uint8_t *)input_00,input_size_00,(long)local_88 - (long)command_buf)
      ;
      if (iVar7 == 0) {
        BrotliStoreMetaBlockHeader(input_size_00,1,(size_t *)table,(uint8_t *)storage_ix);
        iVar7 = *table;
        *(ulong *)table = (ulong)(iVar7 + 7U & 0xfffffff8);
        switchD_00b041bd::default
                  ((void *)((ulong)(iVar7 + 7U >> 3) + (long)storage_ix),input_00,input_size_00);
        uVar15 = input_size_00 * 8 + *(long *)table;
        *(ulong *)table = uVar15;
        *(undefined1 *)((long)storage_ix + (uVar15 >> 3)) = 0;
      }
      else {
        BrotliStoreMetaBlockHeader(input_size_00,0,(size_t *)table,(uint8_t *)storage_ix);
        uVar15 = *(ulong *)table;
        uVar21 = uVar15 >> 3;
        *(ulong *)((long)storage_ix + uVar21) = (ulong)*(byte *)((long)storage_ix + uVar21);
        *(ulong *)table = uVar15 + 0xd;
        StoreCommands(s,(uint8_t *)command_buf,(long)local_88 - (long)command_buf,commands,
                      (long)local_90 - (long)commands >> 2,(size_t *)table,(uint8_t *)storage_ix);
      }
      input_size = input_size - input_size_00;
      input_00 = plVar1;
    } while (input_size != 0);
  }
  return;
code_r0x01140372:
  uVar15 = uVar15 - 8;
  lVar17 = lVar17 + 8;
  if (uVar15 < 8) goto code_r0x01140380;
  goto LAB_01140365;
code_r0x01140380:
  lVar11 = lVar11 + lVar17;
  puVar23 = puVar9 + lVar17;
LAB_0114038c:
  puVar24 = puVar23;
  if (uVar15 != 0) {
    puVar24 = puVar23 + uVar15;
    uVar21 = 0;
    do {
      if (puVar23[uVar21] != *(uint8_t *)(lVar11 + uVar21)) {
        puVar24 = puVar23 + uVar21;
        break;
      }
      uVar21 = uVar21 + 1;
    } while (uVar15 != uVar21);
  }
  lVar17 = (long)puVar24 - (long)puVar9;
LAB_011403c5:
  uVar5 = iVar14 - (int)__src;
  uVar18 = uVar5;
  if (5 < uVar5) {
    if (uVar5 < 0x82) {
      uVar20 = uVar5 - 2;
      uVar18 = 0x1f;
      if (uVar20 != 0) {
        for (; uVar20 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      bVar10 = (char)(uVar18 ^ 0xffffffe0) + 0x1f;
      uVar19 = uVar20 >> (bVar10 & 0x1f);
      uVar18 = (uVar20 - (uVar19 << (bVar10 & 0x1f))) * 0x100 |
               uVar19 + (uVar18 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar5 < 0x842) {
      uVar18 = 0x1f;
      if (uVar5 - 0x42 != 0) {
        for (; uVar5 - 0x42 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      uVar18 = (((-1 << ((byte)uVar18 & 0x1f)) + uVar5 + -0x42) * 0x100 - (uVar18 ^ 0x1f)) + 0x29;
    }
    else {
      iVar14 = uVar5 * 0x100;
      if (uVar5 < 0x1842) {
        uVar18 = iVar14 - 0x841eb;
      }
      else if (uVar5 < 0x5842) {
        uVar18 = iVar14 - 0x1841ea;
      }
      else {
        uVar18 = iVar14 - 0x5841e9;
      }
    }
  }
  *local_90 = uVar18;
  switchD_00b041bd::default(local_88,__src,(long)(int)uVar5);
  uVar18 = 0x40;
  iVar14 = (int)((long)plVar3 - (long)puVar8);
  if (iVar7 != iVar14) {
    uVar20 = iVar14 + 3;
    uVar18 = 0x1f;
    if (uVar20 != 0) {
      for (; uVar20 >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    bVar10 = 0x1e - (char)(uVar18 ^ 0x1f);
    bVar27 = (uVar20 >> (bVar10 & 0x1f) & 1) != 0;
    uVar18 = (uint)bVar27 +
             ((uVar20 - (bVar27 + 2 << (bVar10 & 0x1f))) * 0x100 | (uVar18 ^ 0x1f) * 2 ^ 0x3e) +
             0x4c;
    iVar7 = iVar14;
  }
  uVar15 = lVar17 + 6;
  local_90[1] = uVar18;
  if (uVar15 < 0xc) {
    uVar18 = (int)uVar15 + 0x14;
  }
  else {
    if (0x47 < uVar15) {
      if (uVar15 < 0x88) {
        uVar18 = ((uint)(lVar17 - 2U) & 0x1f) << 8 | (int)(lVar17 - 2U >> 5) + 0x36U;
LAB_0114055e:
        local_90[2] = uVar18;
      }
      else {
        if (0x847 < uVar15) {
          uVar18 = (int)uVar15 * 0x100 - 0x847c1;
          goto LAB_0114055e;
        }
        uVar18 = (int)lVar17 - 0x42;
        iVar14 = 0x1f;
        if (uVar18 != 0) {
          for (; uVar18 >> iVar14 == 0; iVar14 = iVar14 + -1) {
          }
        }
        local_90[2] = ((int)(-1L << ((byte)iVar14 & 0x3f)) + (int)lVar17 + -0x42) * 0x100 + iVar14 +
                      0x34;
      }
      local_90[3] = 0x40;
      lVar11 = 0x10;
      goto LAB_0114056d;
    }
    uVar18 = 0x1f;
    uVar20 = (uint)(lVar17 - 2U);
    if (uVar20 != 0) {
      for (; uVar20 >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    bVar10 = (char)(uVar18 ^ 0xffffffe0) + 0x1f;
    iVar14 = (int)(lVar17 - 2U >> (bVar10 & 0x3f));
    uVar18 = (uVar20 - (iVar14 << (bVar10 & 0x1f))) * 0x100 |
             iVar14 + (uVar18 ^ 0xffffffe0) * 2 + 0x5a;
  }
  local_90[2] = uVar18;
  lVar11 = 0xc;
LAB_0114056d:
  plVar16 = (long *)((long)plVar3 + lVar17 + 6);
  local_88 = (uint32_t *)((long)local_88 + (long)(int)uVar5);
  local_90 = (uint *)((long)local_90 + lVar11);
  __src = plVar16;
  if (plVar26 <= plVar16) goto LAB_0114089c;
  uVar15 = *(ulong *)((long)plVar3 + lVar17 + 1);
  iVar6 = (int)plVar16 - iVar25;
  *(int *)(literal_buf + (uVar15 * 0x1e35a7bd0000 >> 0x30) * 4) = iVar6 + -5;
  *(int *)(literal_buf + ((uVar15 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x30) * 4) = iVar6 + -4;
  *(int *)(literal_buf + ((uVar15 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x30) * 4) = iVar6 + -3;
  uVar15 = *(ulong *)((long)plVar3 + lVar17 + 4);
  uVar21 = (uVar15 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x30;
  *(int *)(literal_buf + (uVar15 * 0x1e35a7bd0000 >> 0x30) * 4) = iVar6 + -2;
  *(int *)(literal_buf + ((uVar15 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x30) * 4) = iVar6 + -1;
  iVar14 = *(int *)(literal_buf + uVar21 * 4);
  *(int *)(literal_buf + uVar21 * 4) = iVar6;
  piVar12 = (int *)(input + iVar14);
  lVar11 = (long)plVar16 - (long)piVar12;
  if ((lVar11 < 0x3fff1) && ((int)*plVar16 == *piVar12)) {
LAB_01140651:
    __src = plVar16;
    if ((*(char *)((long)plVar16 + 4) == (char)piVar12[1]) &&
       (*(char *)((long)plVar16 + 5) == *(char *)((long)piVar12 + 5))) {
      lVar13 = (long)piVar12 + 6;
      lVar17 = (long)plVar16 + 6;
      uVar15 = (long)plVar1 + (-6 - (long)plVar16);
      lVar22 = lVar13;
      if (7 < uVar15) {
        lVar22 = 0;
LAB_01140685:
        if (*(ulong *)(lVar17 + lVar22) == *(ulong *)(lVar13 + lVar22)) goto code_r0x01140692;
        uVar21 = *(ulong *)(lVar13 + lVar22) ^ *(ulong *)(lVar17 + lVar22);
        uVar15 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar15 = (uVar15 >> 3 & 0x1fffffff) + lVar22;
        goto LAB_011406ee;
      }
      goto LAB_011406ac;
    }
  }
  goto LAB_0114027b;
code_r0x01140692:
  uVar15 = uVar15 - 8;
  lVar22 = lVar22 + 8;
  if (uVar15 < 8) goto code_r0x011406a0;
  goto LAB_01140685;
code_r0x011406a0:
  lVar17 = lVar17 + lVar22;
  lVar22 = lVar13 + lVar22;
LAB_011406ac:
  if (uVar15 != 0) {
    uVar21 = 0;
    do {
      uVar2 = uVar21;
      if (*(char *)(lVar22 + uVar21) != *(char *)(lVar17 + uVar21)) break;
      uVar21 = uVar21 + 1;
      uVar2 = uVar15;
    } while (uVar15 != uVar21);
    lVar22 = lVar22 + uVar2;
  }
  uVar15 = lVar22 - lVar13;
LAB_011406ee:
  uVar21 = uVar15 + 6;
  if (uVar21 < 10) {
    uVar18 = (int)uVar21 + 0x26;
  }
  else {
    uVar18 = (uint)uVar15;
    if (uVar21 < 0x86) {
      uVar5 = 0x1f;
      if (uVar18 != 0) {
        for (; uVar18 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      bVar10 = (char)(uVar5 ^ 0xffffffe0) + 0x1f;
      iVar7 = (int)(uVar15 >> (bVar10 & 0x3f));
      uVar18 = (uVar18 - (iVar7 << (bVar10 & 0x1f))) * 0x100 |
               iVar7 + (uVar5 ^ 0xffffffe0) * 2 + 0x6a;
    }
    else if (uVar21 < 0x846) {
      iVar7 = 0x1f;
      if (uVar18 - 0x40 != 0) {
        for (; uVar18 - 0x40 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      uVar18 = iVar7 + ((int)(-1L << ((byte)iVar7 & 0x3f)) + uVar18 + -0x40) * 0x100 + 0x34;
    }
    else {
      uVar18 = (int)uVar21 * 0x100 - 0x845c1;
    }
  }
  __src = (long *)((long)plVar16 + uVar15 + 6);
  *local_90 = uVar18;
  iVar7 = (int)lVar11;
  uVar5 = iVar7 + 3;
  uVar18 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar18 == 0; uVar18 = uVar18 - 1) {
    }
  }
  bVar10 = 0x1e - (char)(uVar18 ^ 0x1f);
  bVar27 = (uVar5 >> (bVar10 & 0x1f) & 1) != 0;
  local_90[1] = (uint)bVar27 +
                ((uVar5 - (bVar27 + 2 << (bVar10 & 0x1f))) * 0x100 | (uVar18 ^ 0x1f) * 2 ^ 0x3e) +
                0x4c;
  local_90 = local_90 + 2;
  if (plVar26 <= __src) goto LAB_0114089c;
  uVar21 = *(ulong *)((long)plVar16 + uVar15 + 1);
  iVar6 = (int)__src - iVar25;
  *(int *)(literal_buf + (uVar21 * 0x1e35a7bd0000 >> 0x30) * 4) = iVar6 + -5;
  *(int *)(literal_buf + ((uVar21 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x30) * 4) = iVar6 + -4;
  *(int *)(literal_buf + ((uVar21 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x30) * 4) = iVar6 + -3;
  uVar15 = *(ulong *)((long)plVar16 + uVar15 + 4);
  uVar21 = (uVar15 & 0xffffffffffff0000) * 0x1e35a7bd >> 0x30;
  *(int *)(literal_buf + (uVar15 * 0x1e35a7bd0000 >> 0x30) * 4) = iVar6 + -2;
  *(int *)(literal_buf + ((uVar15 & 0xffffffffffff00) * 0x1e35a7bd00 >> 0x30) * 4) = iVar6 + -1;
  iVar14 = *(int *)(literal_buf + uVar21 * 4);
  *(int *)(literal_buf + uVar21 * 4) = iVar6;
  piVar12 = (int *)(input + iVar14);
  lVar11 = (long)__src - (long)piVar12;
  if ((0x3fff0 < lVar11) || (plVar16 = __src, (int)*__src != *piVar12)) goto LAB_0114027b;
  goto LAB_01140651;
}

Assistant:

void duckdb_brotli::BrotliCompressFragmentTwoPass(
    BrotliTwoPassArena* s, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          s, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}